

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict type_spec(c2m_ctx_t c2m_ctx,int no_err_p,node_t_conflict arg)

{
  pos_t p;
  pos_t p_00;
  pos_t p_01;
  pos_t p_02;
  pos_t p_03;
  pos_t p_04;
  pos_t p_05;
  pos_t p_06;
  pos_t p_07;
  pos_t p_08;
  pos_t p_09;
  pos_t p_10;
  node_t_conflict n;
  c2m_ctx_t pcVar1;
  int iVar2;
  char *pcVar3;
  node_t_conflict op;
  node_code_t nc;
  code *pcVar4;
  undefined1 local_70 [8];
  pos_t pos;
  int id_p;
  int struct_p;
  node_t_conflict r;
  node_t_conflict op4;
  node_t_conflict op3;
  node_t_conflict op2;
  node_t_conflict op1;
  parse_ctx_t parse_ctx;
  node_t_conflict arg_local;
  c2m_ctx_t pcStack_18;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  op1 = (node_t_conflict)c2m_ctx->parse_ctx;
  pos.lno = 0;
  parse_ctx = (parse_ctx_t)arg;
  arg_local._4_4_ = no_err_p;
  pcStack_18 = c2m_ctx;
  iVar2 = match(c2m_ctx,0x13a,(pos_t *)local_70,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar2 == 0) {
    iVar2 = match(pcStack_18,0x11d,(pos_t *)local_70,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar2 == 0) {
      iVar2 = match(pcStack_18,0x130,(pos_t *)local_70,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar2 == 0) {
        iVar2 = match(pcStack_18,299,(pos_t *)local_70,(node_code_t *)0x0,(node_t_conflict *)0x0);
        if (iVar2 == 0) {
          iVar2 = match(pcStack_18,300,(pos_t *)local_70,(node_code_t *)0x0,(node_t_conflict *)0x0);
          if (iVar2 == 0) {
            iVar2 = match(pcStack_18,0x126,(pos_t *)local_70,(node_code_t *)0x0,
                          (node_t_conflict *)0x0);
            if (iVar2 == 0) {
              iVar2 = match(pcStack_18,0x122,(pos_t *)local_70,(node_code_t *)0x0,
                            (node_t_conflict *)0x0);
              if (iVar2 == 0) {
                iVar2 = match(pcStack_18,0x131,(pos_t *)local_70,(node_code_t *)0x0,
                              (node_t_conflict *)0x0);
                if (iVar2 == 0) {
                  iVar2 = match(pcStack_18,0x139,(pos_t *)local_70,(node_code_t *)0x0,
                                (node_t_conflict *)0x0);
                  if (iVar2 == 0) {
                    iVar2 = match(pcStack_18,0x110,(pos_t *)local_70,(node_code_t *)0x0,
                                  (node_t_conflict *)0x0);
                    if (iVar2 == 0) {
                      iVar2 = match(pcStack_18,0x111,(pos_t *)local_70,(node_code_t *)0x0,
                                    (node_t_conflict *)0x0);
                      if (iVar2 != 0) {
                        if (op1->code == N_IGNORE) {
                          error(pcStack_18,0x1d80e9,(char *)local_70,pos.fname);
                        }
                        c2m_ctx_local = (c2m_ctx_t)&err_struct;
                        return (node_t_conflict)c2m_ctx_local;
                      }
                      iVar2 = match(pcStack_18,0x114,(pos_t *)local_70,(node_code_t *)0x0,
                                    (node_t_conflict *)0x0);
                      if (iVar2 == 0) {
                        pos.ln_pos = match(pcStack_18,0x134,(pos_t *)local_70,(node_code_t *)0x0,
                                           (node_t_conflict *)0x0);
                        if ((pos.ln_pos == 0) &&
                           (iVar2 = match(pcStack_18,0x138,(pos_t *)local_70,(node_code_t *)0x0,
                                          (node_t_conflict *)0x0), iVar2 == 0)) {
                          iVar2 = match(pcStack_18,0x124,(pos_t *)local_70,(node_code_t *)0x0,
                                        (node_t_conflict *)0x0);
                          if (iVar2 == 0) {
                            if (parse_ctx == (parse_ctx_t)0x0) {
                              _id_p = typedef_name(pcStack_18,arg_local._4_4_);
                              if (_id_p == &err_struct) {
                                return _id_p;
                              }
                            }
                            else {
                              _id_p = &err_struct;
                            }
                          }
                          else {
                            iVar2 = match(pcStack_18,0x103,(pos_t *)0x0,(node_code_t *)0x0,&op2);
                            if (iVar2 == 0) {
                              op2 = new_node(pcStack_18,N_IGNORE);
                            }
                            else {
                              pos.lno = 1;
                            }
                            op3 = new_node(pcStack_18,N_LIST);
                            iVar2 = match(pcStack_18,0x7b,(pos_t *)0x0,(node_code_t *)0x0,
                                          (node_t_conflict *)0x0);
                            if (iVar2 == 0) {
                              if (pos.lno == 0) {
                                c2m_ctx_local = (c2m_ctx_t)&err_struct;
                                return (node_t_conflict)c2m_ctx_local;
                              }
                              op3 = new_node(pcStack_18,N_IGNORE);
                            }
                            else {
                              do {
                                iVar2 = match(pcStack_18,0x103,(pos_t *)0x0,(node_code_t *)0x0,
                                              (node_t_conflict *)&id_p);
                                pcVar1 = pcStack_18;
                                if (iVar2 == 0) {
                                  if (op1->code == N_IGNORE) {
                                    pcVar3 = get_token_name(pcStack_18,0x103);
                                    syntax_error(pcVar1,pcVar3);
                                  }
                                  c2m_ctx_local = (c2m_ctx_t)&err_struct;
                                  return (node_t_conflict)c2m_ctx_local;
                                }
                                op4 = _id_p;
                                iVar2 = match(pcStack_18,0x3d,(pos_t *)0x0,(node_code_t *)0x0,
                                              (node_t_conflict *)0x0);
                                if (iVar2 == 0) {
                                  r = new_node(pcStack_18,N_IGNORE);
                                }
                                else {
                                  _id_p = cond_expr(pcStack_18,arg_local._4_4_);
                                  r = _id_p;
                                  if (_id_p == &err_struct) {
                                    return &err_struct;
                                  }
                                }
                                pcVar1 = pcStack_18;
                                n = op3;
                                op = new_node2(pcStack_18,N_ENUM_CONST,op4,r);
                                op_append(pcVar1,n,op);
                                iVar2 = match(pcStack_18,0x2c,(pos_t *)0x0,(node_code_t *)0x0,
                                              (node_t_conflict *)0x0);
                              } while ((iVar2 != 0) && ((short)((op1->op_link).prev)->code != 0x7d))
                              ;
                              iVar2 = match(pcStack_18,0x7d,(pos_t *)0x0,(node_code_t *)0x0,
                                            (node_t_conflict *)0x0);
                              pcVar1 = pcStack_18;
                              if (iVar2 == 0) {
                                if (op1->code == N_IGNORE) {
                                  pcVar3 = get_token_name(pcStack_18,0x7d);
                                  syntax_error(pcVar1,pcVar3);
                                }
                                c2m_ctx_local = (c2m_ctx_t)&err_struct;
                                return (node_t_conflict)c2m_ctx_local;
                              }
                            }
                            p_10._8_8_ = pos.fname;
                            p_10.fname = (char *)local_70;
                            _id_p = new_pos_node2(pcStack_18,N_ENUM,p_10,op2,op3);
                          }
                        }
                        else {
                          iVar2 = match(pcStack_18,0x103,(pos_t *)0x0,(node_code_t *)0x0,&op2);
                          if (iVar2 == 0) {
                            op2 = new_node(pcStack_18,N_IGNORE);
                          }
                          else {
                            pos.lno = 1;
                          }
                          iVar2 = match(pcStack_18,0x7b,(pos_t *)0x0,(node_code_t *)0x0,
                                        (node_t_conflict *)0x0);
                          if (iVar2 == 0) {
                            if (pos.lno == 0) {
                              c2m_ctx_local = (c2m_ctx_t)&err_struct;
                              return (node_t_conflict)c2m_ctx_local;
                            }
                            _id_p = new_node(pcStack_18,N_IGNORE);
                          }
                          else {
                            if (((short)((op1->op_link).prev)->code == 0x7d) ||
                               (iVar2 = match(pcStack_18,0x3b,(pos_t *)0x0,(node_code_t *)0x0,
                                              (node_t_conflict *)0x0), iVar2 != 0)) {
                              pcVar4 = warning;
                              if (pcStack_18->options->pedantic_p != 0) {
                                pcVar4 = error;
                              }
                              (*pcVar4)(pcStack_18,local_70,pos.fname,"empty struct/union");
                              _id_p = new_node(pcStack_18,N_LIST);
                            }
                            else {
                              _id_p = struct_declaration_list(pcStack_18,arg_local._4_4_);
                              if (_id_p == &err_struct) {
                                return &err_struct;
                              }
                            }
                            iVar2 = match(pcStack_18,0x7d,(pos_t *)0x0,(node_code_t *)0x0,
                                          (node_t_conflict *)0x0);
                            pcVar1 = pcStack_18;
                            if (iVar2 == 0) {
                              if (op1->code == N_IGNORE) {
                                pcVar3 = get_token_name(pcStack_18,0x7d);
                                syntax_error(pcVar1,pcVar3);
                              }
                              c2m_ctx_local = (c2m_ctx_t)&err_struct;
                              return (node_t_conflict)c2m_ctx_local;
                            }
                          }
                          nc = N_UNION;
                          if (pos.ln_pos != 0) {
                            nc = N_STRUCT;
                          }
                          p_09._8_8_ = pos.fname;
                          p_09.fname = (char *)local_70;
                          _id_p = new_pos_node2(pcStack_18,nc,p_09,op2,_id_p);
                        }
                      }
                      else {
                        iVar2 = match(pcStack_18,0x28,(pos_t *)0x0,(node_code_t *)0x0,
                                      (node_t_conflict *)0x0);
                        pcVar1 = pcStack_18;
                        if (iVar2 == 0) {
                          if (op1->code == N_IGNORE) {
                            pcVar3 = get_token_name(pcStack_18,0x28);
                            syntax_error(pcVar1,pcVar3);
                          }
                          c2m_ctx_local = (c2m_ctx_t)&err_struct;
                          return (node_t_conflict)c2m_ctx_local;
                        }
                        _id_p = type_name(pcStack_18,arg_local._4_4_);
                        if (_id_p == &err_struct) {
                          return _id_p;
                        }
                        iVar2 = match(pcStack_18,0x29,(pos_t *)0x0,(node_code_t *)0x0,
                                      (node_t_conflict *)0x0);
                        pcVar1 = pcStack_18;
                        if (iVar2 == 0) {
                          if (op1->code == N_IGNORE) {
                            pcVar3 = get_token_name(pcStack_18,0x29);
                            syntax_error(pcVar1,pcVar3);
                          }
                          c2m_ctx_local = (c2m_ctx_t)&err_struct;
                          return (node_t_conflict)c2m_ctx_local;
                        }
                        error(pcStack_18,0x1d810b,(char *)local_70,pos.fname);
                      }
                    }
                    else {
                      p_08._8_8_ = pos.fname;
                      p_08.fname = (char *)local_70;
                      _id_p = new_pos_node(pcStack_18,N_BOOL,p_08);
                    }
                  }
                  else {
                    p_07._8_8_ = pos.fname;
                    p_07.fname = (char *)local_70;
                    _id_p = new_pos_node(pcStack_18,N_UNSIGNED,p_07);
                  }
                }
                else {
                  p_06._8_8_ = pos.fname;
                  p_06.fname = (char *)local_70;
                  _id_p = new_pos_node(pcStack_18,N_SIGNED,p_06);
                }
              }
              else {
                p_05._8_8_ = pos.fname;
                p_05.fname = (char *)local_70;
                _id_p = new_pos_node(pcStack_18,N_DOUBLE,p_05);
              }
            }
            else {
              p_04._8_8_ = pos.fname;
              p_04.fname = (char *)local_70;
              _id_p = new_pos_node(pcStack_18,N_FLOAT,p_04);
            }
          }
          else {
            p_03._8_8_ = pos.fname;
            p_03.fname = (char *)local_70;
            _id_p = new_pos_node(pcStack_18,N_LONG,p_03);
          }
        }
        else {
          p_02._8_8_ = pos.fname;
          p_02.fname = (char *)local_70;
          _id_p = new_pos_node(pcStack_18,N_INT,p_02);
        }
      }
      else {
        p_01._8_8_ = pos.fname;
        p_01.fname = (char *)local_70;
        _id_p = new_pos_node(pcStack_18,N_SHORT,p_01);
      }
    }
    else {
      p_00._8_8_ = pos.fname;
      p_00.fname = (char *)local_70;
      _id_p = new_pos_node(pcStack_18,N_CHAR,p_00);
    }
  }
  else {
    p._8_8_ = pos.fname;
    p.fname = (char *)local_70;
    _id_p = new_pos_node(pcStack_18,N_VOID,p);
  }
  return _id_p;
}

Assistant:

DA (type_spec) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t op1, op2, op3, op4, r;
  int struct_p, id_p = FALSE;
  pos_t pos;

  if (MP (T_VOID, pos)) {
    r = new_pos_node (c2m_ctx, N_VOID, pos);
  } else if (MP (T_CHAR, pos)) {
    r = new_pos_node (c2m_ctx, N_CHAR, pos);
  } else if (MP (T_SHORT, pos)) {
    r = new_pos_node (c2m_ctx, N_SHORT, pos);
  } else if (MP (T_INT, pos)) {
    r = new_pos_node (c2m_ctx, N_INT, pos);
  } else if (MP (T_LONG, pos)) {
    r = new_pos_node (c2m_ctx, N_LONG, pos);
  } else if (MP (T_FLOAT, pos)) {
    r = new_pos_node (c2m_ctx, N_FLOAT, pos);
  } else if (MP (T_DOUBLE, pos)) {
    r = new_pos_node (c2m_ctx, N_DOUBLE, pos);
  } else if (MP (T_SIGNED, pos)) {
    r = new_pos_node (c2m_ctx, N_SIGNED, pos);
  } else if (MP (T_UNSIGNED, pos)) {
    r = new_pos_node (c2m_ctx, N_UNSIGNED, pos);
  } else if (MP (T_BOOL, pos)) {
    r = new_pos_node (c2m_ctx, N_BOOL, pos);
  } else if (MP (T_COMPLEX, pos)) {
    if (record_level == 0) error (c2m_ctx, pos, "complex numbers are not supported");
    return err_node;
  } else if (MP (T_ATOMIC, pos)) { /* atomic-type-specifier */
    PT ('(');
    P (type_name);
    PT (')');
    error (c2m_ctx, pos, "Atomic types are not supported");
  } else if ((struct_p = MP (T_STRUCT, pos)) || MP (T_UNION, pos)) {
    /* struct-or-union-specifier, struct-or-union */
    if (!MN (T_ID, op1)) {
      op1 = new_node (c2m_ctx, N_IGNORE);
    } else {
      id_p = TRUE;
    }
    if (M ('{')) {
      if (!C ('}') && !M (';')) {
        P (struct_declaration_list);
      } else {
        (c2m_options->pedantic_p ? error : warning) (c2m_ctx, pos, "empty struct/union");
        r = new_node (c2m_ctx, N_LIST);
      }
      PT ('}');
    } else if (!id_p) {
      return err_node;
    } else {
      r = new_node (c2m_ctx, N_IGNORE);
    }
    r = new_pos_node2 (c2m_ctx, struct_p ? N_STRUCT : N_UNION, pos, op1, r);
  } else if (MP (T_ENUM, pos)) { /* enum-specifier */
    if (!MN (T_ID, op1)) {
      op1 = new_node (c2m_ctx, N_IGNORE);
    } else {
      id_p = TRUE;
    }
    op2 = new_node (c2m_ctx, N_LIST);
    if (M ('{')) { /* enumerator-list */
      for (;;) {   /* enumerator */
        PTN (T_ID);
        op3 = r; /* enumeration-constant */
        if (!M ('=')) {
          op4 = new_node (c2m_ctx, N_IGNORE);
        } else {
          P (const_expr);
          op4 = r;
        }
        op_append (c2m_ctx, op2, new_node2 (c2m_ctx, N_ENUM_CONST, op3, op4));
        if (!M (',')) break;
        if (C ('}')) break;
      }
      PT ('}');
    } else if (!id_p) {
      return err_node;
    } else {
      op2 = new_node (c2m_ctx, N_IGNORE);
    }
    r = new_pos_node2 (c2m_ctx, N_ENUM, pos, op1, op2);
  } else if (arg == NULL) {
    P (typedef_name);
  } else {
    r = err_node;
  }
  return r;
}